

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O2

NaControlLawSource StrToSourceIO(char *str)

{
  int iVar1;
  NaControlLawSource NVar2;
  
  iVar1 = strcmp(str,"description");
  if (iVar1 == 0) {
    NVar2 = clsDescription;
  }
  else {
    iVar1 = strcmp(str,"from_file");
    if (iVar1 == 0) {
      NVar2 = clsFromFile;
    }
    else {
      iVar1 = strcmp(str,"manual");
      if (iVar1 == 0) {
        NVar2 = clsManual;
      }
      else {
        iVar1 = strcmp(str,"random");
        NVar2 = __clsNumber - (iVar1 == 0);
      }
    }
  }
  return NVar2;
}

Assistant:

NaControlLawSource  StrToSourceIO (const char* str)
{
    if(!strcmp(str, SourceToStrIO(clsDescription)))
        return clsDescription;
    else if(!strcmp(str, SourceToStrIO(clsFromFile)))
        return clsFromFile;
    else if(!strcmp(str, SourceToStrIO(clsManual)))
        return clsManual;
    else if(!strcmp(str, SourceToStrIO(clsRandom)))
        return clsRandom;
    else
        return __clsNumber;
}